

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids)

{
  bool bVar1;
  Status SVar2;
  size_type sVar3;
  reference pvVar4;
  element_type *peVar5;
  char *this_00;
  v10 *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  bool local_e1a;
  Error local_e00;
  anon_class_1_0_00000001 local_dd2;
  v10 local_dd1;
  v10 *local_dd0;
  size_t local_dc8;
  string local_dc0;
  Error local_da0;
  anon_class_1_0_00000001 local_d72;
  v10 local_d71;
  v10 *local_d70;
  size_t local_d68;
  string local_d60;
  Error local_d40;
  byte local_d11;
  undefined1 local_d10 [7];
  v10 local_d09;
  v10 *local_d08;
  undefined1 local_d00 [8];
  string local_cf8;
  byte local_cd4;
  anon_class_1_0_00000001 local_cd2;
  v10 local_cd1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd0;
  char *local_cc8;
  string local_cc0;
  Error local_ca0;
  Status local_c74;
  anon_class_1_0_00000001 local_c72;
  v10 local_c71;
  RegistryStatus status_1;
  v10 *pvStack_c70;
  size_t local_c68;
  string local_c60;
  Error local_c40;
  anon_class_1_0_00000001 local_c12;
  v10 local_c11;
  v10 *local_c10;
  size_t local_c08;
  string local_c00;
  Error local_be0;
  anon_class_1_0_00000001 local_bb2;
  v10 local_bb1;
  v10 *local_bb0;
  char *local_ba8;
  string local_ba0;
  Error local_b80;
  int local_b58;
  anon_class_1_0_00000001 local_b52;
  v10 local_b51;
  v10 *local_b50;
  size_t local_b48;
  string local_b40;
  Error local_b20;
  anon_class_1_0_00000001 local_af2;
  v10 local_af1;
  v10 *local_af0;
  size_t local_ae8;
  string local_ae0;
  Error local_ac0;
  string local_a98;
  string local_a78;
  string local_a58 [8];
  string errorMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias_1;
  iterator __end3_1;
  iterator __begin3_1;
  StringArray *__range3_1;
  undefined1 local_a10 [7];
  RegistryStatus status;
  StringArray unresolved;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9f0;
  char *local_9e8;
  string local_9e0;
  Error local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  iterator __end3;
  iterator __begin3;
  StringArray *__range3;
  v10 *local_970;
  size_t local_968;
  string local_960;
  Error local_940;
  anon_class_1_0_00000001 local_912;
  v10 local_911;
  v10 *local_910;
  char *local_908;
  string local_900;
  Error local_8e0;
  byte local_8a1;
  undefined1 local_8a0 [7];
  bool supported;
  Error error;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids_local;
  Expression *aExpr_local;
  Interpreter *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_858 [3];
  undefined1 local_840 [16];
  v10 *local_830;
  ulong local_828;
  v10 *local_820;
  size_t sStack_818;
  string *local_810;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_808 [3];
  undefined1 local_7f0 [16];
  v10 *local_7e0;
  ulong local_7d8;
  v10 *local_7d0;
  size_t sStack_7c8;
  string *local_7c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_7b8 [3];
  undefined1 local_7a0 [16];
  v10 *local_790;
  ulong local_788;
  v10 *local_780;
  size_t sStack_778;
  string *local_770;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_768 [3];
  undefined1 local_750 [16];
  v10 *local_740;
  ulong local_738;
  v10 *local_730;
  size_t sStack_728;
  string *local_720;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_718 [3];
  undefined1 local_700 [16];
  v10 *local_6f0;
  ulong local_6e8;
  v10 *local_6e0;
  size_t sStack_6d8;
  string *local_6d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_6c8 [3];
  undefined1 local_6b0 [16];
  v10 *local_6a0;
  ulong local_698;
  v10 *local_690;
  size_t sStack_688;
  string *local_680;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_678 [3];
  undefined1 local_660 [16];
  v10 *local_650;
  ulong local_648;
  v10 *local_640;
  size_t sStack_638;
  string *local_630;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_628 [2];
  undefined1 local_618 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_608;
  char *local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  char *pcStack_5e8;
  string *local_5e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> *local_5d8 [2]
  ;
  undefined1 local_5c8 [16];
  v10 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  v10 *local_5a0;
  char *pcStack_598;
  string *local_590;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> *local_588 [2]
  ;
  undefined1 local_578 [16];
  v10 *local_568;
  char *local_560;
  char *local_558;
  v10 *local_550;
  char *pcStack_548;
  string *local_540;
  v10 *local_538;
  v10 **local_530;
  v10 *local_528;
  v10 **local_520;
  v10 *local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_510;
  v10 *local_508;
  v10 **local_500;
  v10 *local_4f8;
  v10 **local_4f0;
  v10 *local_4e8;
  v10 **local_4e0;
  v10 *local_4d8;
  v10 **local_4d0;
  v10 *local_4c8;
  undefined1 *local_4c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_4b8 [2];
  undefined1 local_4a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_498;
  char *local_490;
  reference local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  char *pcStack_478;
  string *local_470;
  v10 *local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_460;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_458;
  undefined1 local_438 [16];
  v10 *local_428;
  char *local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_418;
  reference local_410;
  v10 *local_408;
  char *pcStack_400;
  undefined1 *local_3f8;
  v10 *local_3f0;
  v10 **local_3e8;
  v10 *local_3e0;
  v10 **local_3d8;
  v10 *local_3d0;
  v10 **local_3c8;
  v10 **local_3c0;
  v10 *local_3b8;
  size_t sStack_3b0;
  v10 **local_3a0;
  v10 *local_398;
  size_t sStack_390;
  v10 **local_380;
  v10 *local_378;
  size_t sStack_370;
  v10 **local_360;
  v10 *local_358;
  size_t sStack_350;
  v10 **local_340;
  v10 *local_338;
  size_t sStack_330;
  v10 **local_320;
  v10 *local_318;
  size_t sStack_310;
  v10 **local_300;
  v10 *local_2f8;
  size_t sStack_2f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2e0;
  undefined1 *local_2d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2d0;
  undefined1 *local_2c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2c0;
  undefined1 *local_2b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2b0;
  undefined1 *local_2a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2a0;
  undefined1 *local_298;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_290;
  undefined1 *local_288;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_280;
  undefined1 *local_278;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_268;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_260;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_258;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_250;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_248;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_240;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_238;
  undefined8 local_230;
  undefined1 *local_228;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_220;
  undefined8 local_218;
  undefined1 *local_210;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_208;
  undefined8 local_200;
  undefined1 *local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1f0;
  undefined8 local_1e8;
  undefined1 *local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1c0;
  undefined8 local_1b8;
  undefined1 *local_1b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_1a8;
  undefined8 local_1a0;
  undefined1 *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_188;
  char *pcStack_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_170;
  undefined1 *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_160;
  undefined8 local_158;
  undefined1 *local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_148;
  undefined1 *local_140;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_138;
  undefined8 local_130;
  undefined1 *local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_118;
  v10 **local_110;
  v10 *local_108;
  char *pcStack_100;
  v10 **local_f0;
  v10 *local_e8;
  char *pcStack_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_d0;
  undefined1 *local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_c0;
  undefined8 local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_90;
  undefined8 local_88;
  undefined1 *local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]> **local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  char *pcStack_60;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_10;
  
  error.mMessage.field_2._8_8_ = aNids;
  Error::Error((Error *)local_8a0);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this);
  if (sVar3 == 0) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->mContext).mDomAliases);
    if (sVar3 == 0) {
      ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_d72);
      local_3d8 = &local_d70;
      local_3e0 = &local_d71;
      bVar6 = ::fmt::v10::operator()(local_3e0);
      local_d68 = bVar6.size_;
      local_d70 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_7c0 = &local_d60;
      local_7d0 = local_d70;
      sStack_7c8 = local_d68;
      local_320 = &local_7d0;
      local_7e0 = local_d70;
      local_7d8 = local_d68;
      local_318 = local_7e0;
      sStack_310 = local_7d8;
      local_808[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_288 = local_7f0;
      local_290 = local_808;
      local_218 = 0;
      fmt_09.size_ = 0;
      fmt_09.data_ = (char *)local_7d8;
      args_09.field_1.values_ = in_R9.values_;
      args_09.desc_ = (unsigned_long_long)local_290;
      local_268 = local_290;
      local_220 = local_290;
      local_210 = local_288;
      ::fmt::v10::vformat_abi_cxx11_(&local_d60,local_7e0,fmt_09,args_09);
      Error::Error(&local_d40,kInvalidArgs,&local_d60);
      Error::~Error(&local_d40);
      std::__cxx11::string::~string((string *)&local_d60);
    }
    else {
      this_01 = mMultiNetworkSyntax_abi_cxx11_;
      local_8a1 = IsFeatureSupported(this,(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                           *)mMultiNetworkSyntax_abi_cxx11_,aExpr);
      if ((bool)local_8a1) {
        sVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)this);
        if (sVar3 == 0) {
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&(this->mContext).mDomAliases);
          if (sVar3 < 2) {
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->mRegistry);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::front(&(this->mContext).mDomAliases);
            local_c74 = persistent_storage::Registry::GetNetworkXpansInDomain
                                  (peVar5,pvVar4,
                                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   error.mMessage.field_2._8_8_);
            if (local_c74 == kSuccess) goto LAB_00261da2;
            local_cd4 = 0;
            local_d11 = 0;
            if (local_c74 == kNotFound) {
              ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_cd2);
              local_460 = &local_cd0;
              local_468 = &local_cd1;
              bVar6 = ::fmt::v10::operator()(local_468);
              local_cc8 = (char *)bVar6.size_;
              local_cd0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          bVar6.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_488 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&(this->mContext).mDomAliases,0);
              local_470 = &local_cc0;
              local_480 = local_cd0;
              pcStack_478 = local_cc8;
              local_70 = &local_480;
              local_498 = local_cd0;
              local_490 = local_cc8;
              local_68 = local_498;
              pcStack_60 = local_490;
              local_4b8[0] = ::fmt::v10::
                             make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                                       ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_488,(v10 *)local_470,local_cd0);
              local_168 = local_4a8;
              local_170 = local_4b8;
              local_158 = 0xd;
              fmt_07.size_ = 0xd;
              fmt_07.data_ = local_490;
              args_07.field_1.values_ = in_R9.values_;
              args_07.desc_ = (unsigned_long_long)local_170;
              local_160 = local_170;
              local_150 = local_168;
              local_118 = local_170;
              ::fmt::v10::vformat_abi_cxx11_(&local_cc0,(v10 *)local_498,fmt_07,args_07);
              local_cd4 = 1;
              Error::Error(&local_ca0,kRegistryError,&local_cc0);
            }
            else {
              ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(local_d10 + 6));
              local_3e8 = &local_d08;
              local_3f0 = &local_d09;
              bVar6 = ::fmt::v10::operator()(local_3f0);
              local_d00 = (undefined1  [8])bVar6.size_;
              local_d08 = (v10 *)bVar6.data_;
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_FMT_COMPILE_STRING,_0>
                        ();
              local_410 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::front(&(this->mContext).mDomAliases);
              local_d10._0_4_ = ZEXT14(local_c74);
              local_3f8 = local_d00 + 8;
              local_408 = local_d08;
              pcStack_400 = (char *)local_d00;
              local_418 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d10;
              local_50 = &local_408;
              local_428 = local_d08;
              local_420 = (char *)local_d00;
              local_48 = local_428;
              pcStack_40 = local_420;
              ::fmt::v10::
              make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,int>
                        (&local_458,(v10 *)local_410,local_418,(int *)local_d08);
              local_30 = local_438;
              local_38 = &local_458;
              local_20 = 0x1d;
              fmt_08.size_ = 0x1d;
              fmt_08.data_ = local_420;
              args_08.field_1.values_ = in_R9.values_;
              args_08.desc_ = (unsigned_long_long)local_38;
              local_28 = local_38;
              local_18 = local_30;
              local_10 = local_38;
              ::fmt::v10::vformat_abi_cxx11_((string *)(local_d00 + 8),local_428,fmt_08,args_08);
              local_d11 = 1;
              Error::Error(&local_ca0,kRegistryError,(string *)(local_d00 + 8));
            }
            Error::operator=((Error *)local_8a0,&local_ca0);
            Error::~Error(&local_ca0);
            if ((local_d11 & 1) != 0) {
              std::__cxx11::string::~string((string *)(local_d00 + 8));
            }
            if ((local_cd4 & 1) != 0) {
              std::__cxx11::string::~string((string *)&local_cc0);
            }
          }
          else {
            ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_c72);
            local_4c0 = (undefined1 *)&stack0xfffffffffffff390;
            local_4c8 = &local_c71;
            bVar6 = ::fmt::v10::operator()(local_4c8);
            local_c68 = bVar6.size_;
            pvStack_c70 = (v10 *)bVar6.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_770 = &local_c60;
            local_780 = pvStack_c70;
            sStack_778 = local_c68;
            local_340 = &local_780;
            local_790 = pvStack_c70;
            local_788 = local_c68;
            local_338 = local_790;
            sStack_330 = local_788;
            local_7b8[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_298 = local_7a0;
            local_2a0 = local_7b8;
            local_200 = 0;
            fmt_06.size_ = 0;
            fmt_06.data_ = (char *)local_788;
            args_06.field_1.values_ = in_R9.values_;
            args_06.desc_ = (unsigned_long_long)local_2a0;
            local_260 = local_2a0;
            local_208 = local_2a0;
            local_1f8 = local_298;
            ::fmt::v10::vformat_abi_cxx11_(&local_c60,local_790,fmt_06,args_06);
            Error::Error(&local_c40,kInvalidArgs,&local_c60);
            Error::operator=((Error *)local_8a0,&local_c40);
            Error::~Error(&local_c40);
            std::__cxx11::string::~string((string *)&local_c60);
          }
        }
        else {
          ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_c12);
          local_4d0 = &local_c10;
          local_4d8 = &local_c11;
          bVar6 = ::fmt::v10::operator()(local_4d8);
          local_c08 = bVar6.size_;
          local_c10 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_720 = &local_c00;
          local_730 = local_c10;
          sStack_728 = local_c08;
          local_360 = &local_730;
          local_740 = local_c10;
          local_738 = local_c08;
          local_358 = local_740;
          sStack_350 = local_738;
          local_768[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_2a8 = local_750;
          local_2b0 = local_768;
          local_1e8 = 0;
          fmt_05.size_ = 0;
          fmt_05.data_ = (char *)local_738;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)local_2b0;
          local_258 = local_2b0;
          local_1f0 = local_2b0;
          local_1e0 = local_2a8;
          ::fmt::v10::vformat_abi_cxx11_(&local_c00,local_740,fmt_05,args_05);
          Error::Error(&local_be0,kInvalidArgs,&local_c00);
          Error::operator=((Error *)local_8a0,&local_be0);
          Error::~Error(&local_be0);
          std::__cxx11::string::~string((string *)&local_c00);
        }
      }
      else {
        ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_bb2);
        local_4e0 = &local_bb0;
        local_4e8 = &local_bb1;
        bVar6 = ::fmt::v10::operator()(local_4e8);
        local_ba8 = (char *)bVar6.size_;
        local_bb0 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::check_format_string<const_char_(&)[6],_FMT_COMPILE_STRING,_0>();
        local_590 = &local_ba0;
        local_5a0 = local_bb0;
        pcStack_598 = local_ba8;
        local_5a8 = "--dom";
        local_f0 = &local_5a0;
        local_5b8 = local_bb0;
        local_5b0 = local_ba8;
        local_e8 = local_5b8;
        pcStack_e0 = local_5b0;
        local_5d8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[6]>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]>
                                   *)"--dom",this_01,(char (*) [6])local_590);
        local_98 = local_5c8;
        local_a0 = local_5d8;
        local_88 = 0xc;
        fmt_04.size_ = 0xc;
        fmt_04.data_ = local_5b0;
        args_04.field_1.values_ = in_R9.values_;
        args_04.desc_ = (unsigned_long_long)local_a0;
        local_90 = local_a0;
        local_80 = local_98;
        local_78 = local_a0;
        ::fmt::v10::vformat_abi_cxx11_(&local_ba0,local_5b8,fmt_04,args_04);
        Error::Error(&local_b80,kInvalidArgs,&local_ba0);
        Error::operator=((Error *)local_8a0,&local_b80);
        Error::~Error(&local_b80);
        std::__cxx11::string::~string((string *)&local_ba0);
      }
    }
  }
  else {
    this_00 = (char *)mMultiNetworkSyntax_abi_cxx11_;
    local_8a1 = IsFeatureSupported(this,(vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                         *)mMultiNetworkSyntax_abi_cxx11_,aExpr);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&(this->mContext).mImportFiles);
    local_e1a = false;
    if (sVar3 != 0) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
      local_e1a = false;
      if (sVar3 == 1) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)this,0);
        this_00 = "all";
        bVar1 = std::operator!=(pvVar4,"all");
        local_e1a = false;
        if (bVar1) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this,0);
          this_00 = "other";
          local_e1a = std::operator!=(pvVar4,"other");
        }
      }
    }
    local_8a1 = (local_8a1 & 1) != 0 || local_e1a != false;
    if ((bool)local_8a1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->mContext).mDomAliases);
      if (sVar3 == 0) {
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
        alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&alias), bVar1) {
          local_998 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          bVar1 = std::operator==(local_998,"all");
          if (((bVar1) || (bVar1 = std::operator==(local_998,"other"), bVar1)) &&
             (sVar3 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this), sVar3 != 1)) {
            ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)
                       ((long)&unresolved.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
            local_510 = &local_9f0;
            local_518 = (v10 *)((long)&unresolved.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
            bVar6 = ::fmt::v10::operator()(local_518);
            local_9e8 = (char *)bVar6.size_;
            local_9f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        bVar6.data_;
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            local_5e0 = &local_9e0;
            local_5f0 = local_9f0;
            pcStack_5e8 = local_9e8;
            local_5f8 = local_998;
            local_190 = &local_5f0;
            local_608 = local_9f0;
            local_600 = local_9e8;
            local_188 = local_608;
            pcStack_180 = local_600;
            local_628[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                     ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_998,(v10 *)local_5e0,local_9f0);
            local_140 = local_618;
            local_148 = local_628;
            local_130 = 0xd;
            fmt_01.size_ = 0xd;
            fmt_01.data_ = local_600;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_148;
            local_138 = local_148;
            local_128 = local_140;
            local_120 = local_148;
            ::fmt::v10::vformat_abi_cxx11_(&local_9e0,(v10 *)local_608,fmt_01,args_01);
            Error::Error(&local_9c0,kInvalidArgs,&local_9e0);
            Error::operator=((Error *)local_8a0,&local_9c0);
            Error::~Error(&local_9c0);
            std::__cxx11::string::~string((string *)&local_9e0);
            goto LAB_00261fb7;
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a10);
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->mRegistry);
        SVar2 = persistent_storage::Registry::GetNetworkXpansByAliases
                          (peVar5,(StringArray *)this,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           error.mMessage.field_2._8_8_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a10);
        __end3_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_a10);
        alias_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_a10);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&alias_1), bVar1) {
          errorMessage.field_2._8_8_ =
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end3_1);
          std::__cxx11::string::string(local_a58);
          if (SVar2 < kDataInvalid) {
            std::__cxx11::string::operator=(local_a58,"alias not found");
          }
          else if (SVar2 == kAmbiguity) {
            std::__cxx11::string::operator=(local_a58,"alias ambiguous");
          }
          else {
            std::__cxx11::string::operator=(local_a58,"failed to resolve");
          }
          std::__cxx11::string::string((string *)&local_a78,(string *)errorMessage.field_2._8_8_);
          std::__cxx11::string::string((string *)&local_a98,local_a58);
          PrintNetworkMessage(this,&local_a78,&local_a98,kYellow);
          std::__cxx11::string::~string((string *)&local_a98);
          std::__cxx11::string::~string((string *)&local_a78);
          std::__cxx11::string::~string(local_a58);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3_1);
        }
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           error.mMessage.field_2._8_8_);
        if (sVar3 == 0) {
          ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_af2);
          local_500 = &local_af0;
          local_508 = &local_af1;
          bVar6 = ::fmt::v10::operator()(local_508);
          local_ae8 = bVar6.size_;
          local_af0 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_680 = &local_ae0;
          local_690 = local_af0;
          sStack_688 = local_ae8;
          local_3a0 = &local_690;
          local_6a0 = local_af0;
          local_698 = local_ae8;
          local_398 = local_6a0;
          sStack_390 = local_698;
          local_6c8[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_2c8 = local_6b0;
          local_2d0 = local_6c8;
          local_1b8 = 0;
          fmt_02.size_ = 0;
          fmt_02.data_ = (char *)local_698;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_2d0;
          local_248 = local_2d0;
          local_1c0 = local_2d0;
          local_1b0 = local_2c8;
          ::fmt::v10::vformat_abi_cxx11_(&local_ae0,local_6a0,fmt_02,args_02);
          Error::Error(&local_ac0,kRegistryError,&local_ae0);
          Error::operator=((Error *)local_8a0,&local_ac0);
          Error::~Error(&local_ac0);
          std::__cxx11::string::~string((string *)&local_ae0);
          local_b58 = 4;
        }
        else if (SVar2 == kSuccess) {
          local_b58 = 0;
        }
        else {
          ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_b52);
          local_4f0 = &local_b50;
          local_4f8 = &local_b51;
          bVar6 = ::fmt::v10::operator()(local_4f8);
          local_b48 = bVar6.size_;
          local_b50 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_6d0 = &local_b40;
          local_6e0 = local_b50;
          sStack_6d8 = local_b48;
          local_380 = &local_6e0;
          local_6f0 = local_b50;
          local_6e8 = local_b48;
          local_378 = local_6f0;
          sStack_370 = local_6e8;
          local_718[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
          ;
          local_2b8 = local_700;
          local_2c0 = local_718;
          local_1d0 = 0;
          fmt_03.size_ = 0;
          fmt_03.data_ = (char *)local_6e8;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_2c0;
          local_250 = local_2c0;
          local_1d8 = local_2c0;
          local_1c8 = local_2b8;
          ::fmt::v10::vformat_abi_cxx11_(&local_b40,local_6f0,fmt_03,args_03);
          Error::Error(&local_b20,kRegistryError,&local_b40);
          Error::operator=((Error *)local_8a0,&local_b20);
          Error::~Error(&local_b20);
          std::__cxx11::string::~string((string *)&local_b40);
          local_b58 = 4;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a10);
        if (local_b58 == 0) {
LAB_00261da2:
          sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             error.mMessage.field_2._8_8_);
          if (sVar3 == 0) {
            ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_dd2);
            local_3c8 = &local_dd0;
            local_3d0 = &local_dd1;
            bVar6 = ::fmt::v10::operator()(local_3d0);
            local_dc8 = bVar6.size_;
            local_dd0 = (v10 *)bVar6.data_;
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            local_810 = &local_dc0;
            local_820 = local_dd0;
            sStack_818 = local_dc8;
            local_300 = &local_820;
            local_830 = local_dd0;
            local_828 = local_dc8;
            local_2f8 = local_830;
            sStack_2f0 = local_828;
            local_858[0] = ::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
            local_278 = local_840;
            local_280 = local_858;
            local_230 = 0;
            fmt_10.size_ = 0;
            fmt_10.data_ = (char *)local_828;
            args_10.field_1.values_ = in_R9.values_;
            args_10.desc_ = (unsigned_long_long)local_280;
            local_270 = local_280;
            local_238 = local_280;
            local_228 = local_278;
            ::fmt::v10::vformat_abi_cxx11_(&local_dc0,local_830,fmt_10,args_10);
            Error::Error(&local_da0,kInvalidArgs,&local_dc0);
            Error::operator=((Error *)local_8a0,&local_da0);
            Error::~Error(&local_da0);
            std::__cxx11::string::~string((string *)&local_dc0);
          }
        }
        else if (local_b58 != 4) goto LAB_0026201e;
      }
      else {
        ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&__range3 + 6));
        local_520 = &local_970;
        local_528 = (v10 *)((long)&__range3 + 7);
        bVar6 = ::fmt::v10::operator()(local_528);
        local_968 = bVar6.size_;
        local_970 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_630 = &local_960;
        local_640 = local_970;
        sStack_638 = local_968;
        local_3c0 = &local_640;
        local_650 = local_970;
        local_648 = local_968;
        local_3b8 = local_650;
        sStack_3b0 = local_648;
        local_678[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_2d8 = local_660;
        local_2e0 = local_678;
        local_1a0 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_648;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_2e0;
        local_240 = local_2e0;
        local_1a8 = local_2e0;
        local_198 = local_2d8;
        ::fmt::v10::vformat_abi_cxx11_(&local_960,local_650,fmt_00,args_00);
        Error::Error(&local_940,kInvalidArgs,&local_960);
        Error::operator=((Error *)local_8a0,&local_940);
        Error::~Error(&local_940);
        std::__cxx11::string::~string((string *)&local_960);
      }
    }
    else {
      ValidateMultiNetworkSyntax::anon_class_1_0_00000001::operator()(&local_912);
      local_530 = &local_910;
      local_538 = &local_911;
      bVar6 = ::fmt::v10::operator()(local_538);
      local_908 = (char *)bVar6.size_;
      local_910 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<const_char_(&)[6],_FMT_COMPILE_STRING,_0>();
      local_540 = &local_900;
      local_550 = local_910;
      pcStack_548 = local_908;
      local_558 = "--nwk";
      local_110 = &local_550;
      local_568 = local_910;
      local_560 = local_908;
      local_108 = local_568;
      pcStack_100 = local_560;
      local_588[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[6]>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[6]>
                                 *)"--nwk",(v10 *)this_00,(char (*) [6])local_540);
      local_c8 = local_578;
      local_d0 = local_588;
      local_b8 = 0xc;
      fmt.size_ = 0xc;
      fmt.data_ = local_560;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_d0;
      local_c0 = local_d0;
      local_b0 = local_c8;
      local_a8 = local_d0;
      ::fmt::v10::vformat_abi_cxx11_(&local_900,local_568,fmt,args);
      Error::Error(&local_8e0,kInvalidArgs,&local_900);
      Error::operator=((Error *)local_8a0,&local_8e0);
      Error::~Error(&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
    }
  }
LAB_00261fb7:
  Error::Error(&local_e00,(Error *)local_8a0);
  Value::Value(__return_storage_ptr__,&local_e00);
  Error::~Error(&local_e00);
  local_b58 = 1;
LAB_0026201e:
  Error::~Error((Error *)local_8a0);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ValidateMultiNetworkSyntax(const Expression &aExpr, std::vector<uint64_t> &aNids)
{
    Error error;
    bool  supported;

    if (mContext.mNwkAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        // MN-syntax is also supported for import from multi-entry JSON
        supported |= mContext.mImportFiles.size() > 0 && mContext.mNwkAliases.size() == 1 &&
                     mContext.mNwkAliases[0] != ALIAS_ALL && mContext.mNwkAliases[0] != ALIAS_OTHERS;
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_NETWORK));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mDomAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // validate group alias usage; if used, it must be alone
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
            {
                VerifyOrExit(mContext.mNwkAliases.size() == 1, error = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
            }
        }
        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, aNids, unresolved);
        for (const auto &alias : unresolved)
        {
            std::string errorMessage;
            switch (status)
            {
            case RegistryStatus::kAmbiguity:
                errorMessage = "alias ambiguous";
                break;
            case RegistryStatus::kSuccess:  // partially successful resolution
            case RegistryStatus::kNotFound: // failed to find any
                errorMessage = "alias not found";
                break;
            default:
                errorMessage = RUNTIME_RESOLVING_FAILED;
            }
            PrintNetworkMessage(alias, errorMessage, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(aNids.size() > 0, error = ERROR_REGISTRY_ERROR(RUNTIME_EMPTY_NIDS));
        VerifyOrExit(status == RegistryStatus::kSuccess, error = ERROR_REGISTRY_ERROR(RUNTIME_RESOLVING_FAILED));
    }
    else if (mContext.mDomAliases.size() > 0)
    {
        // verify if respective syntax supported by the current command
        supported = IsFeatureSupported(mMultiNetworkSyntax, aExpr);
        VerifyOrExit(supported, error = ERROR_INVALID_ARGS(SYNTAX_NOT_SUPPORTED, KEYWORD_DOMAIN));
        // network and domain must not be specified simultaneously
        VerifyOrExit(mContext.mNwkAliases.size() == 0, error = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));
        // domain must be single
        VerifyOrExit(mContext.mDomAliases.size() < 2, error = ERROR_INVALID_ARGS(SYNTAX_MULTI_DOMAIN));
        RegistryStatus status = mRegistry->GetNetworkXpansInDomain(mContext.mDomAliases.front(), aNids);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     error = status == RegistryStatus::kNotFound
                                 ? ERROR_REGISTRY_ERROR("domain '{}' not found", mContext.mDomAliases[0])
                                 : ERROR_REGISTRY_ERROR("domain '{}' failed to resolve with status={}",
                                                        mContext.mDomAliases.front(), static_cast<int>(status)));
    }
    else
    {
        // as we came here to evaluate multi-network command, either
        // network or domain list must have entries
        VerifyOrExit(false,
                     ERROR_INVALID_ARGS(
                         "Either network or domain list must have entries for multi-network command")); // must not hit
                                                                                                        // this, ever
    }

    VerifyOrExit(aNids.size() > 0, error = ERROR_INVALID_ARGS(RUNTIME_EMPTY_NIDS));
exit:
    return error;
}